

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O2

void __thiscall FParser::SF_MobjTarget(FParser *this)

{
  FState *newstate;
  bool bVar1;
  AActor *pAVar2;
  AActor *pAVar3;
  
  bVar1 = CheckArgs(this,1);
  if (!bVar1) {
    return;
  }
  pAVar2 = actorvalue(this->t_argv);
  if ((this->t_argc < 2) ||
     (pAVar3 = actorvalue(this->t_argv + 1), pAVar3 == (AActor *)0x0 || pAVar2 == (AActor *)0x0)) {
    (this->t_return).type = 2;
    if (pAVar2 != (AActor *)0x0) goto LAB_004f20d7;
  }
  else {
    newstate = pAVar2->SeeState;
    if (newstate != (FState *)0x0) {
      (pAVar2->target).field_0.p = pAVar3;
      AActor::SetState(pAVar2,newstate,false);
      *(byte *)&(pAVar2->flags).Value = (byte)(pAVar2->flags).Value | 0x40;
    }
    (this->t_return).type = 2;
LAB_004f20d7:
    pAVar2 = (pAVar2->target).field_0.p;
    if (pAVar2 != (AActor *)0x0) {
      pAVar3 = (AActor *)0x0;
      if (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        pAVar3 = pAVar2;
      }
      goto LAB_004f20f1;
    }
  }
  pAVar3 = (AActor *)0x0;
LAB_004f20f1:
  (this->t_return).value.mobj = pAVar3;
  return;
}

Assistant:

void FParser::SF_MobjTarget(void)
{
	AActor*  mo;
	AActor*  target;
	
	if (CheckArgs(1))
	{
		mo = actorvalue(t_argv[0]);
		if(t_argc > 1)
		{
			target = actorvalue(t_argv[1]);
			if(mo && target && mo->SeeState) // haleyjd: added target check -- no NULL allowed
			{
				mo->target=target;
				mo->SetState(mo->SeeState);
				mo->flags|=MF_JUSTHIT;
			}
		}
		
		t_return.type = svt_mobj;
		t_return.value.mobj = mo ? mo->target : NULL;
	}
}